

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureLPS25H.cpp
# Opt level: O3

bool __thiscall RTPressureLPS25H::pressureInit(RTPressureLPS25H *this)

{
  uchar slaveAddr;
  RTIMUSettings *this_00;
  bool bVar1;
  
  this_00 = (this->super_RTPressure).m_settings;
  slaveAddr = this_00->m_I2CPressureAddress;
  this->m_pressureAddr = slaveAddr;
  bVar1 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,slaveAddr,' ',0xc4,
                             "Failed to set LPS25H CTRL_REG_1");
  if (bVar1) {
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                               this->m_pressureAddr,'\x10','\x05',"Failed to set LPS25H RES_CONF");
    if (bVar1) {
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                 this->m_pressureAddr,'.',0xc0,"Failed to set LPS25H FIFO_CTRL");
      if (bVar1) {
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                   this->m_pressureAddr,'!','@',"Failed to set LPS25H CTRL_REG_2");
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool RTPressureLPS25H::pressureInit()
{
    m_pressureAddr = m_settings->m_I2CPressureAddress;

    if (!m_settings->HALWrite(m_pressureAddr, LPS25H_CTRL_REG_1, 0xc4, "Failed to set LPS25H CTRL_REG_1"))
        return false;

    if (!m_settings->HALWrite(m_pressureAddr, LPS25H_RES_CONF, 0x05, "Failed to set LPS25H RES_CONF"))
        return false;

    if (!m_settings->HALWrite(m_pressureAddr, LPS25H_FIFO_CTRL, 0xc0, "Failed to set LPS25H FIFO_CTRL"))
        return false;

    if (!m_settings->HALWrite(m_pressureAddr, LPS25H_CTRL_REG_2, 0x40, "Failed to set LPS25H CTRL_REG_2"))
        return false;

    return true;
}